

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O2

char * archive_entry_pathname(archive_entry *entry)

{
  wchar_t wVar1;
  int iVar2;
  int *piVar3;
  char *p;
  
  wVar1 = archive_mstring_get_mbs(entry->archive,&entry->ae_pathname,&p);
  if (wVar1 != L'\0') {
    piVar3 = __errno_location();
    iVar2 = *piVar3;
    if (iVar2 == 0x54) {
      wVar1 = archive_mstring_get_utf8(entry->archive,&entry->ae_pathname,&p);
      if (wVar1 == L'\0') {
        return p;
      }
      iVar2 = *piVar3;
    }
    if (iVar2 == 0xc) {
      __archive_errx(1,"No memory");
    }
    p = (char *)0x0;
  }
  return p;
}

Assistant:

const char *
archive_entry_pathname(struct archive_entry *entry)
{
	const char *p;
	if (archive_mstring_get_mbs(
	    entry->archive, &entry->ae_pathname, &p) == 0)
		return (p);
#if HAVE_EILSEQ  /*{*/
    if (errno == EILSEQ) {
	    if (archive_mstring_get_utf8(
	        entry->archive, &entry->ae_pathname, &p) == 0)
		    return (p);
    }
#endif  /*}*/
	if (errno == ENOMEM)
		__archive_errx(1, "No memory");
	return (NULL);
}